

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsWebServer.cpp
# Opt level: O3

void __thiscall Listener::on_accept(Listener *this,error_code eCode,socket *socket)

{
  undefined1 local_21;
  HttpSession *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  if ((eCode._0_8_ >> 0x20 & 1) == 0) {
    if (this->websocket == true) {
      std::__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<WebSocketsession>,boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                ((__shared_ptr<WebSocketsession,(__gnu_cxx::_Lock_policy)2> *)&local_20,
                 (allocator<WebSocketsession> *)&local_21,socket);
      WebSocketsession::run((WebSocketsession *)local_20);
    }
    else {
      std::__shared_ptr<HttpSession,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<std::allocator<HttpSession>,boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                ((__shared_ptr<HttpSession,(__gnu_cxx::_Lock_policy)2> *)&local_20,
                 (allocator<HttpSession> *)&local_21,socket);
      HttpSession::do_read(local_20);
    }
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    do_accept(this);
    return;
  }
  fail(eCode,"helics accept connections");
  return;
}

Assistant:

void handle_request(http::request<Body, http::basic_fields<Allocator>>&& req, Send&& send)
{
    static const std::string index_page = generateIndexPage();
    // Returns a bad request response
    auto const bad_request = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::bad_request, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // Returns a bad request response
    auto const not_found = [&req](std::string_view why) {
        http::response<http::string_body> res{http::status::not_found, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, "text/html");
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");

        res.body() = std::string(why);
        res.prepare_payload();
        return res;
    };

    // generate a conversion response
    auto const response_ok = [&req](const std::string& resp, std::string_view content_type) {
        http::response<http::string_body> res{http::status::ok, req.version()};
        res.set(http::field::server, "HELICS_WEB_SERVER " HELICS_VERSION_STRING);
        res.set(http::field::content_type, content_type);
        res.keep_alive(req.keep_alive());

        res.set(http::field::access_control_allow_origin, "*");
        res.set(http::field::access_control_allow_methods, "*");
        res.set(http::field::access_control_allow_headers, "*");

        if (req.method() != http::verb::head) {
            res.body() = resp;
            res.prepare_payload();
        } else {
            res.set(http::field::content_length, std::to_string(resp.size()));
        }
        return res;
    };

    RestCommand command{RestCommand::QUERY};

    auto method = req.method();
    switch (method) {
        case http::verb::head:
        case http::verb::search:
        case http::verb::get:
            break;
        case http::verb::post:
        case http::verb::put:
            command = RestCommand::CREATE;
            break;
        case http::verb::delete_:
            command = RestCommand::REMOVE;
            break;
        case http::verb::options:
            return send(response_ok("{\"success\":true}", "application/json"));
        default:
            return send(bad_request("Unknown HTTP-method"));
    }

    const std::string_view target(req.target());
    auto psize = req.payload_size();
    if (target == "/index.html" || target == "index.html" ||
        (target == "/" && (!psize || *psize < 4))) {
        return send(response_ok(index_page, "text/html"));
    }

    if (target == "/healthcheck" || target == "healthcheck") {
        return send(response_ok("{\"success\":true}", "application/json"));
    }

    auto reqpr = processRequestParameters(target, req.body());
    std::string brokerName;
    std::string query;
    std::string targetObj;

    partitionTarget(reqpr.first, brokerName, query, targetObj);

    if (method == http::verb::post) {
        if (brokerName == "delete" || brokerName == "remove") {
            command = RestCommand::REMOVE;
            brokerName.clear();
        } else if (brokerName == "create") {
            command = RestCommand::CREATE;
            brokerName.clear();
        } else if (brokerName == "query" || brokerName == "search") {
            command = RestCommand::QUERY;
            brokerName.clear();
        } else if (brokerName == "command") {
            command = RestCommand::COMMAND;
            brokerName.clear();
        }
    }
    auto res = generateResults(command, brokerName, targetObj, query, reqpr.second);
    switch (res.first) {
        case RequestReturnVal::BAD_REQUEST:
            return send(bad_request(res.second));
        case RequestReturnVal::NOT_FOUND:
            return send(not_found(res.second));
        case RequestReturnVal::OK:
        default:
            if (res.second.empty()) {
                return send(response_ok(index_page, "text/html"));
            }
            if (res.second.front() == '{') {
                return send(response_ok(res.second, "application/json"));
            }
            return send(response_ok(res.second, "text/plain"));
    }
}